

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_ioctl.c
# Opt level: O2

void decode_nvrm_ioctl_create_dma56(nvrm_ioctl_create_dma56 *s)

{
  uint uVar1;
  uint32_t status;
  uint64_t uVar2;
  FILE *__stream;
  int iVar3;
  char *pcVar4;
  
  uVar1 = s->cid;
  if (uVar1 == 0) {
    iVar3 = _nvrm_field_enabled("cid");
    if (iVar3 != 0) goto LAB_002561bb;
  }
  else {
LAB_002561bb:
    fprintf(_stdout,"%scid: 0x%08x",nvrm_pfx,(ulong)uVar1);
  }
  pcVar4 = nvrm_sep;
  nvrm_pfx = nvrm_sep;
  uVar1 = s->handle;
  if (uVar1 == 0) {
    iVar3 = _nvrm_field_enabled("handle");
    if (iVar3 != 0) goto LAB_00256201;
  }
  else {
LAB_00256201:
    fprintf(_stdout,"%shandle: 0x%08x",pcVar4,(ulong)uVar1);
    nvrm_pfx = nvrm_sep;
    describe_nvrm_object(s->cid,s->handle,"handle");
  }
  if (s->_pad1 != 0) {
    fprintf(_stdout,"%s%s_pad1: 0x%08x%s",nvrm_pfx,colors->err,(ulong)s->_pad1,colors->reset);
  }
  nvrm_pfx = nvrm_sep;
  fprintf(_stdout,"%sclass: 0x%04x",nvrm_sep,(ulong)s->cls);
  pcVar4 = nvrm_get_class_name(s->cls);
  if (pcVar4 != (char *)0x0) {
    fprintf(_stdout," [%s]",pcVar4);
  }
  pcVar4 = nvrm_sep;
  nvrm_pfx = nvrm_sep;
  uVar1 = s->flags;
  if (uVar1 == 0) {
    iVar3 = _nvrm_field_enabled("flags");
    if (iVar3 != 0) goto LAB_002562e7;
  }
  else {
LAB_002562e7:
    fprintf(_stdout,"%sflags: 0x%08x",pcVar4,(ulong)uVar1);
    pcVar4 = nvrm_sep;
  }
  if (s->_pad2 != 0) {
    nvrm_pfx = pcVar4;
    fprintf(_stdout,"%s%s_pad2: 0x%08x%s",pcVar4,colors->err,(ulong)s->_pad2,colors->reset);
    pcVar4 = nvrm_sep;
  }
  uVar1 = s->parent;
  nvrm_pfx = pcVar4;
  if (uVar1 == 0) {
    iVar3 = _nvrm_field_enabled("parent");
    if (iVar3 != 0) goto LAB_00256360;
  }
  else {
LAB_00256360:
    fprintf(_stdout,"%sparent: 0x%08x",pcVar4,(ulong)uVar1);
    nvrm_pfx = nvrm_sep;
    describe_nvrm_object(s->cid,s->parent,"parent");
  }
  if (s->_pad3 != 0) {
    fprintf(_stdout,"%s%s_pad3: 0x%08x%s",nvrm_pfx,colors->err,(ulong)s->_pad3,colors->reset);
  }
  pcVar4 = nvrm_sep;
  nvrm_pfx = nvrm_sep;
  uVar2 = s->base;
  if (uVar2 == 0) {
    iVar3 = _nvrm_field_enabled("base");
    if (iVar3 != 0) goto LAB_002563f0;
  }
  else {
LAB_002563f0:
    fprintf(_stdout,"%sbase: 0x%016lx",pcVar4,uVar2);
    pcVar4 = nvrm_sep;
  }
  uVar2 = s->limit;
  nvrm_pfx = pcVar4;
  if (uVar2 == 0) {
    iVar3 = _nvrm_field_enabled("limit");
    if (iVar3 != 0) goto LAB_0025642f;
  }
  else {
LAB_0025642f:
    fprintf(_stdout,"%slimit: 0x%016lx",pcVar4,uVar2);
    pcVar4 = nvrm_sep;
  }
  status = s->status;
  nvrm_pfx = pcVar4;
  if (status == 0) {
    iVar3 = _nvrm_field_enabled("status");
    if (iVar3 != 0) goto LAB_0025646c;
  }
  else {
LAB_0025646c:
    __stream = _stdout;
    nvrm_status(status);
    fprintf(__stream,"%sstatus: %s",pcVar4,nvrm_status::buf);
    pcVar4 = nvrm_sep;
  }
  uVar1 = s->unk34;
  nvrm_pfx = pcVar4;
  if (uVar1 == 0) {
    iVar3 = _nvrm_field_enabled("unk34");
    if (iVar3 == 0) goto LAB_002564d5;
  }
  fprintf(_stdout,"%sunk34: 0x%08x",pcVar4,(ulong)uVar1);
  pcVar4 = nvrm_sep;
LAB_002564d5:
  nvrm_pfx = pcVar4;
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
    return;
  }
  return;
}

Assistant:

static void decode_nvrm_ioctl_create_dma56(struct nvrm_ioctl_create_dma56 *s)
{
	nvrm_print_cid(s, cid);
	nvrm_print_handle(s, handle, cid);
	nvrm_print_pad_x32(s, _pad1);
	nvrm_print_class(s, cls);
	nvrm_print_x32(s, flags);
	nvrm_print_pad_x32(s, _pad2);
	nvrm_print_handle(s, parent, cid);
	nvrm_print_pad_x32(s, _pad3);
	nvrm_print_x64(s, base);
	nvrm_print_x64(s, limit);
	nvrm_print_status(s, status);
	nvrm_print_x32(s, unk34);
	nvrm_print_ln();
}